

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

Vec4 __thiscall glcts::SetLum(glcts *this,Vec4 *cbase,Vec4 *clum)

{
  float fVar1;
  float fVar2;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar3;
  Vector<float,_4> VVar4;
  Vec4 VVar5;
  Vector<float,_4> local_bc;
  Vector<float,_4> local_ac;
  Vector<float,_4> local_9c;
  Vector<float,_4> local_8c;
  Vector<float,_4> local_7c;
  Vector<float,_4> local_6c;
  undefined1 local_5c [8];
  Vec4 vllum;
  undefined1 local_3c [8];
  Vec4 color;
  float ldiff;
  float llum;
  float lbase;
  Vec4 *clum_local;
  Vec4 *cbase_local;
  undefined1 auVar6 [12];
  undefined8 uVar7;
  
  fVar1 = Luminance(cbase);
  color.m_data[3] = Luminance(clum);
  color.m_data[2] = color.m_data[3] - fVar1;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vllum.m_data + 2),color.m_data[2]);
  tcu::operator+((tcu *)local_3c,cbase,(Vector<float,_4> *)(vllum.m_data + 2));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_5c,color.m_data[3]);
  fVar1 = MinRGB((Vec4 *)local_3c);
  if (0.0 <= fVar1) {
    fVar1 = MaxRGB((Vec4 *)local_3c);
    uVar3 = 0x3f800000;
    if (fVar1 <= 1.0) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,(Vector<float,_4> *)local_3c);
      VVar4.m_data[2] = (float)(int)uVar3;
      VVar4.m_data[3] = (float)(int)((ulong)uVar3 >> 0x20);
      VVar4.m_data[0] = (float)(int)extraout_XMM0_Qa;
      VVar4.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
    }
    else {
      tcu::operator-((tcu *)&local_bc,(Vector<float,_4> *)local_3c,(Vector<float,_4> *)local_5c);
      tcu::operator*((tcu *)&local_ac,&local_bc,1.0 - color.m_data[3]);
      fVar1 = MaxRGB((Vec4 *)local_3c);
      tcu::operator/((tcu *)&local_9c,&local_ac,fVar1 - color.m_data[3]);
      VVar4 = tcu::operator+((tcu *)this,(Vector<float,_4> *)local_5c,&local_9c);
    }
  }
  else {
    tcu::operator-((tcu *)&local_8c,(Vector<float,_4> *)local_3c,(Vector<float,_4> *)local_5c);
    tcu::operator*((tcu *)&local_7c,&local_8c,color.m_data[3]);
    fVar1 = color.m_data[3];
    fVar2 = MinRGB((Vec4 *)local_3c);
    tcu::operator/((tcu *)&local_6c,&local_7c,fVar1 - fVar2);
    VVar4 = tcu::operator+((tcu *)this,(Vector<float,_4> *)local_5c,&local_6c);
  }
  VVar5.m_data[0] = VVar4.m_data[0];
  auVar6._4_4_ = VVar4.m_data[1];
  register0x00001240 = VVar4.m_data[2];
  register0x00001244 = VVar4.m_data[3];
  return (Vec4)VVar5.m_data;
}

Assistant:

static tcu::Vec4 SetLum(const tcu::Vec4& cbase, const tcu::Vec4& clum)
{
	float	 lbase = Luminance(cbase);
	float	 llum  = Luminance(clum);
	float	 ldiff = llum - lbase;
	tcu::Vec4 color = cbase + tcu::Vec4(ldiff);
	tcu::Vec4 vllum = tcu::Vec4(llum);
	if (MinRGB(color) < 0.0f)
	{
		return vllum + ((color - vllum) * llum) / (llum - MinRGB(color));
	}
	else if (MaxRGB(color) > 1.0f)
	{
		return vllum + ((color - vllum) * (1.f - llum)) / (MaxRGB(color) - llum);
	}
	else
	{
		return color;
	}
}